

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_auth_login_resp(connectdata *conn,int pop3code,pop3state instate)

{
  char *local_38;
  char *authuser;
  size_t len;
  SessionHandle *data;
  pop3state local_18;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  len = (size_t)conn->data;
  authuser = (char *)0x0;
  local_38 = (char *)0x0;
  local_18 = instate;
  result = pop3code;
  _instate_local = conn;
  if (pop3code == 0x2b) {
    data._4_4_ = Curl_sasl_create_login_message
                           ((SessionHandle *)len,conn->user,&local_38,(size_t *)&authuser);
    if (((data._4_4_ == CURLE_OK) && (local_38 != (char *)0x0)) &&
       (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",local_38),
       data._4_4_ == CURLE_OK)) {
      state(_instate_local,POP3_AUTH_LOGIN_PASSWD);
    }
  }
  else {
    Curl_failf((SessionHandle *)len,"Access denied: %d",(ulong)(uint)pop3code);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  if (local_38 != (char *)0x0) {
    (*Curl_cfree)(local_38);
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_auth_login_resp(struct connectdata *conn,
                                           int pop3code,
                                           pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  size_t len = 0;
  char *authuser = NULL;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied: %d", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else {
    /* Create the user message */
    result = Curl_sasl_create_login_message(data, conn->user,
                                            &authuser, &len);
    if(!result && authuser) {
      /* Send the user */
      result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s", authuser);

      if(!result)
        state(conn, POP3_AUTH_LOGIN_PASSWD);
    }
  }

  Curl_safefree(authuser);

  return result;
}